

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_DRAGON(effect_handler_context_t_conflict *context)

{
  effect *effect;
  _Bool _Var1;
  player_shape *ppVar2;
  source sVar3;
  source origin;
  source origin_00;
  _Bool ident;
  wchar_t dir;
  
  ppVar2 = player_shape_by_idx(context->subtype);
  ident = false;
  dir = L'\x05';
  if (ppVar2 != (player_shape *)0x0) {
    _Var1 = player_is_shapechanged(player);
    if (_Var1) {
      get_aim_dir(&dir);
      player_confuse_dir(player,&dir,false);
      effect = ppVar2->breath->effect;
      sVar3 = source_player();
      origin.which = sVar3.which;
      origin._4_4_ = 0;
      origin.what = sVar3.what;
      _Var1 = effect_do(effect,origin,(object *)0x0,&ident,true,dir,L'\0',L'\0',(command *)0x0);
    }
    else {
      sVar3 = source_none();
      origin_00.which = sVar3.which;
      origin_00._4_4_ = 0;
      origin_00.what = sVar3.what;
      effect_simple(L'k',origin_00,"0",context->subtype,L'\0',L'\0',L'\0',L'\0',&ident);
      _Var1 = true;
    }
    return _Var1;
  }
  __assert_fail("shape",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-general.c"
                ,0xeef,"_Bool effect_handler_DRAGON(effect_handler_context_t *)");
}

Assistant:

bool effect_handler_DRAGON(effect_handler_context_t *context)
{
	struct player_shape *shape = player_shape_by_idx(context->subtype);
	bool ident = false;
	int dir = DIR_TARGET;

	assert(shape);

	/* Change shape... */
	if (!player_is_shapechanged(player)) {
		effect_simple(EF_SHAPECHANGE, source_none(), "0", context->subtype, 0,
					  0, 0, 0, &ident);
	} else {
		/* ...or breathe */
		get_aim_dir(&dir);
		player_confuse_dir(player, &dir, false);
		return effect_do(shape->breath->effect, source_player(), NULL, &ident,
						 true, dir, 0, 0, NULL);
	}

	return true;
}